

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::AddSignalSemaphore
          (DeviceContextVkImpl *this,ManagedSemaphore *pSignalSemaphore)

{
  pointer *pppVVar1;
  iterator __position;
  iterator __position_00;
  char (*in_RCX) [28];
  string msg;
  string local_38;
  ManagedSemaphore *local_18;
  
  local_18 = pSignalSemaphore;
  if (pSignalSemaphore == (ManagedSemaphore *)0x0) {
    FormatString<char[26],char[28]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pSignalSemaphore != nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AddSignalSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x15d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
  ::
  emplace_back<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>*&>
            ((vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
              *)&this->m_SignalManagedSemaphores,&local_18);
  local_38._M_dataplus._M_p = (pointer)(local_18->m_VkObject).m_VkObject;
  __position._M_current =
       (this->m_VkSignalSemaphores).
       super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::_M_realloc_insert<VkSemaphore_T*>
              ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)&this->m_VkSignalSemaphores,
               __position,(VkSemaphore_T **)&local_38);
  }
  else {
    *__position._M_current = (VkSemaphore_T *)local_38._M_dataplus._M_p;
    pppVVar1 = &(this->m_VkSignalSemaphores).
                super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  local_38._M_dataplus._M_p = (pointer)0x0;
  __position_00._M_current =
       (this->m_SignalSemaphoreValues).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->m_SignalSemaphoreValues,__position_00,(unsigned_long *)&local_38);
  }
  else {
    *__position_00._M_current = 0;
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void AddSignalSemaphore(ManagedSemaphore* pSignalSemaphore)
    {
        VERIFY_EXPR(pSignalSemaphore != nullptr);
        m_SignalManagedSemaphores.emplace_back(pSignalSemaphore);
        m_VkSignalSemaphores.push_back(pSignalSemaphore->Get());
        m_SignalSemaphoreValues.push_back(0); // Ignored for binary semaphore
    }